

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Satisfier<CPubKey>::ToPKBytes(Satisfier<CPubKey> *this,Key *key)

{
  long lVar1;
  uchar *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  allocator<unsigned_char> *in_stack_ffffffffffffff98;
  CPubKey *this_00;
  allocator_type *in_stack_ffffffffffffffd0;
  CPubKey *__first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  __first = in_RDI;
  CPubKey::begin((CPubKey *)in_stack_ffffffffffffff98);
  CPubKey::end(this_00);
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff98);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            (in_RSI,__first->vch,in_RDX,in_stack_ffffffffffffffd0);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(const Key& key) const { return {key.begin(), key.end()}; }